

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O3

Node * prvTidyFindBody(TidyDocImpl *doc)

{
  TidyTagId TVar1;
  Node *pNVar2;
  
  if ((doc == (TidyDocImpl *)0x0) || (pNVar2 = (doc->root).content, pNVar2 == (Node *)0x0)) {
    return (Node *)0x0;
  }
  while ((pNVar2->tag == (Dict *)0x0 || (pNVar2->tag->id != TidyTag_HTML))) {
    pNVar2 = pNVar2->next;
    if (pNVar2 == (Node *)0x0) {
      return (Node *)0x0;
    }
  }
  pNVar2 = pNVar2->content;
  do {
    if (pNVar2 == (Node *)0x0) {
      return (Node *)0x0;
    }
    if (pNVar2->tag != (Dict *)0x0) {
      TVar1 = pNVar2->tag->id;
      if (TVar1 == TidyTag_BODY) {
        return pNVar2;
      }
      if (TVar1 == TidyTag_FRAMESET) {
        pNVar2 = pNVar2->content;
        if (pNVar2 == (Node *)0x0) {
          return (Node *)0x0;
        }
        while ((pNVar2->tag == (Dict *)0x0 || (pNVar2->tag->id != TidyTag_NOFRAMES))) {
          pNVar2 = pNVar2->next;
          if (pNVar2 == (Node *)0x0) {
            return (Node *)0x0;
          }
        }
        pNVar2 = pNVar2->content;
        if (pNVar2 != (Node *)0x0) {
          while ((pNVar2->tag == (Dict *)0x0 || (pNVar2->tag->id != TidyTag_BODY))) {
            pNVar2 = pNVar2->next;
            if (pNVar2 == (Node *)0x0) {
              return (Node *)0x0;
            }
          }
          return pNVar2;
        }
        return (Node *)0x0;
      }
    }
    pNVar2 = pNVar2->next;
  } while( true );
}

Assistant:

Node *TY_(FindBody)( TidyDocImpl* doc )
{
    Node *node = ( doc ? doc->root.content : NULL );

    while ( node && !nodeIsHTML(node) )
        node = node->next;

    if (node == NULL)
        return NULL;

    node = node->content;
    while ( node && !nodeIsBODY(node) && !nodeIsFRAMESET(node) )
        node = node->next;

    if ( node && nodeIsFRAMESET(node) )
    {
        node = node->content;
        while ( node && !nodeIsNOFRAMES(node) )
            node = node->next;

        if ( node )
        {
            node = node->content;
            while ( node && !nodeIsBODY(node) )
                node = node->next;
        }
    }

    return node;
}